

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsMan.c
# Opt level: O3

Mfs_Man_t * Mfs_ManAlloc(Mfs_Par_t *pPars)

{
  ulong uVar1;
  uint uVar2;
  Mfs_Man_t *pMVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  void **ppvVar6;
  void **ppvVar7;
  Vec_Ptr_t *pVVar8;
  Int_Man_t *pIVar9;
  Vec_Vec_t *pVVar10;
  void *pvVar11;
  int iVar12;
  ulong uVar13;
  void **ppvVar14;
  long lVar15;
  
  pMVar3 = (Mfs_Man_t *)calloc(1,0x388);
  pMVar3->pPars = pPars;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  pMVar3->vProjVarsCnf = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  pMVar3->vProjVarsSat = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  pMVar3->vDivLits = pVVar4;
  lVar15 = (long)pPars->nWinMax;
  uVar2 = pPars->nWinMax + 0xc;
  iVar12 = (((int)uVar2 >> 5) + 1) - (uint)((uVar2 & 0x1f) == 0);
  pMVar3->nDivWords = iVar12;
  uVar1 = lVar15 + 0xd;
  ppvVar6 = (void **)malloc(((long)iVar12 * 4 + 8) * uVar1);
  if (-0xd < lVar15) {
    ppvVar7 = ppvVar6 + lVar15 + 0xd;
    uVar13 = uVar1 & 0xffffffff;
    ppvVar14 = ppvVar6;
    do {
      *ppvVar14 = ppvVar7;
      ppvVar14 = ppvVar14 + 1;
      ppvVar7 = (void **)((long)ppvVar7 + (long)iVar12 * 4);
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  }
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  pVVar8->nSize = (int)uVar1;
  pVVar8->nCap = (int)uVar1;
  pVVar8->pArray = ppvVar6;
  pMVar3->vDivCexes = pVVar8;
  lVar15 = 0;
  pIVar9 = Int_ManAlloc();
  pMVar3->pMan = pIVar9;
  pVVar4 = (Vec_Int_t *)calloc(1,0x10);
  pMVar3->vMem = pVVar4;
  pVVar10 = (Vec_Vec_t *)malloc(0x10);
  pVVar10->nCap = 0x20;
  ppvVar6 = (void **)malloc(0x100);
  pVVar10->pArray = ppvVar6;
  do {
    pvVar11 = calloc(1,0x10);
    ppvVar6[lVar15] = pvVar11;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0x20);
  pVVar10->nSize = 0x20;
  pMVar3->vLevels = pVVar10;
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  pVVar8->nCap = 0x20;
  pVVar8->nSize = 0;
  ppvVar6 = (void **)malloc(0x100);
  pVVar8->pArray = ppvVar6;
  pMVar3->vMfsFanins = pVVar8;
  return pMVar3;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Mfs_Man_t * Mfs_ManAlloc( Mfs_Par_t * pPars )
{
    Mfs_Man_t * p;
    // start the manager
    p = ABC_ALLOC( Mfs_Man_t, 1 );
    memset( p, 0, sizeof(Mfs_Man_t) );
    p->pPars     = pPars;
    p->vProjVarsCnf = Vec_IntAlloc( 100 );
    p->vProjVarsSat = Vec_IntAlloc( 100 );
    p->vDivLits  = Vec_IntAlloc( 100 );
    p->nDivWords = Abc_BitWordNum(p->pPars->nWinMax + MFS_FANIN_MAX);
    p->vDivCexes = Vec_PtrAllocSimInfo( p->pPars->nWinMax + MFS_FANIN_MAX + 1, p->nDivWords );
    p->pMan      = Int_ManAlloc();
    p->vMem      = Vec_IntAlloc( 0 );
    p->vLevels   = Vec_VecStart( 32 );
    p->vMfsFanins= Vec_PtrAlloc( 32 );
    return p;
}